

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O1

void __thiscall SymbolTable::clear(SymbolTable *this)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  
  this->lenHisto[0] = 0;
  this->lenHisto[1] = 0;
  this->lenHisto[2] = 0;
  this->lenHisto[3] = 0;
  this->lenHisto[4] = 0;
  this->lenHisto[5] = 0;
  this->lenHisto[6] = 0;
  this->lenHisto[7] = 0;
  this->lenHisto[8] = 0;
  uVar1 = this->nSymbols;
  if (uVar1 != 0) {
    lVar2 = 0;
    do {
      uVar3 = *(ulong *)((long)&this->symbols[0x100].val + lVar2);
      iVar4 = (int)(*(ulong *)((long)&this->symbols[0x100].icl + lVar2) >> 0x1c);
      if (iVar4 == 2) {
        this->shortCodes[uVar3 & 0xffff] = (ushort)uVar3 & 0xff | 0x1000;
      }
      else if (iVar4 == 1) {
        this->byteCodes[uVar3 & 0xff] = (short)(uVar3 & 0xff) + 0x1000;
      }
      else {
        uVar5 = ((uint)uVar3 & 0xffffff) * -0x4ee6db1f;
        uVar3 = (ulong)(((uVar5 >> 0xf ^ uVar5) & 0x3ff) << 4);
        *(undefined8 *)((long)&this->hashTab[0].val + uVar3) = 0;
        *(undefined8 *)((long)&this->hashTab[0].icl + uVar3) = 0xf1ff0000;
      }
      lVar2 = lVar2 + 0x10;
    } while ((ulong)uVar1 * 0x10 != lVar2);
  }
  this->nSymbols = 0;
  return;
}

Assistant:

void clear() {
      // clear a symbolTable with minimal effort (only erase the used positions in it)
      memset(lenHisto, 0, sizeof(lenHisto)); // all unused
      for(u32 i=FSST_CODE_BASE; i<FSST_CODE_BASE+nSymbols; i++) {
          if (symbols[i].length() == 1) {
              u16 val = symbols[i].first();
              byteCodes[val] = (1<<FSST_LEN_BITS) | val;
          } else if (symbols[i].length() == 2) {
              u16 val = symbols[i].first2();
              shortCodes[val] = (1<<FSST_LEN_BITS) | (val&255);
          } else {
              u32 idx = symbols[i].hash() & (hashTabSize-1);
              hashTab[idx].val.num = 0;
              hashTab[idx].icl = FSST_ICL_FREE; //marks empty in hashtab
          }           
      } 
      nSymbols = 0; // no need to clean symbols[] as no symbols are used
   }